

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::bc1_find_sels4_noerr
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long in_RDI;
  uint32_t in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  long in_stack_00000010;
  int d3;
  int d2;
  int d1;
  int d0;
  uint32_t i_1;
  int t2;
  int t1;
  int t0;
  uint32_t i;
  int dots [4];
  int ab;
  int ag;
  int ar;
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  uint32_t in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff70;
  uint local_8c;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff80;
  uint local_7c;
  int local_78 [8];
  int local_58 [4];
  int local_48 [4];
  int local_38 [12];
  long local_8;
  
  local_8 = in_RDI;
  bc1_get_block_colors4
            ((uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_00000008),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff54,in_R9D),in_stack_ffffffffffffff4c,in_R8D
             ,0,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
    local_78[local_7c] =
         local_38[local_7c] * (local_38[3] - local_38[0]) +
         local_48[local_7c] * (local_48[3] - local_48[0]) +
         local_58[local_7c] * (local_58[3] - local_58[0]);
  }
  local_78[0] = local_78[0] + local_78[1];
  local_78[1] = local_78[1] + local_78[2];
  local_78[2] = local_78[2] + local_78[3];
  iVar1 = (local_38[3] - local_38[0]) * 2;
  iVar2 = (local_48[3] - local_48[0]) * 2;
  iVar3 = (local_58[3] - local_58[0]) * 2;
  for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 4) {
    iVar4 = (uint)*(byte *)(local_8 + (ulong)local_8c * 4) * iVar1 +
            (uint)*(byte *)(local_8 + 1 + (ulong)local_8c * 4) * iVar2 +
            (uint)*(byte *)(local_8 + 2 + (ulong)local_8c * 4) * iVar3;
    iVar5 = (uint)*(byte *)(local_8 + (ulong)(local_8c + 1) * 4) * iVar1 +
            (uint)*(byte *)(local_8 + 1 + (ulong)(local_8c + 1) * 4) * iVar2 +
            (uint)*(byte *)(local_8 + 2 + (ulong)(local_8c + 1) * 4) * iVar3;
    iVar6 = (uint)*(byte *)(local_8 + (ulong)(local_8c + 2) * 4) * iVar1 +
            (uint)*(byte *)(local_8 + 1 + (ulong)(local_8c + 2) * 4) * iVar2 +
            (uint)*(byte *)(local_8 + 2 + (ulong)(local_8c + 2) * 4) * iVar3;
    iVar7 = (uint)*(byte *)(local_8 + (ulong)(local_8c + 3) * 4) * iVar1 +
            (uint)*(byte *)(local_8 + 1 + (ulong)(local_8c + 3) * 4) * iVar2 +
            (uint)*(byte *)(local_8 + 2 + (ulong)(local_8c + 3) * 4) * iVar3;
    *(uint8_t *)(in_stack_00000010 + (ulong)local_8c) =
         "\x03\x02\x01"
         [(int)((uint)(iVar4 <= local_78[0]) + (uint)(iVar4 < local_78[1]) +
               (uint)(iVar4 < local_78[2]))];
    *(uint8_t *)(in_stack_00000010 + (ulong)(local_8c + 1)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar5 <= local_78[0]) + (uint)(iVar5 < local_78[1]) +
               (uint)(iVar5 < local_78[2]))];
    *(uint8_t *)(in_stack_00000010 + (ulong)(local_8c + 2)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar6 <= local_78[0]) + (uint)(iVar6 < local_78[1]) +
               (uint)(iVar6 < local_78[2]))];
    *(uint8_t *)(in_stack_00000010 + (ulong)(local_8c + 3)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar7 <= local_78[0]) + (uint)(iVar7 < local_78[1]) +
               (uint)(iVar7 < local_78[2]))];
  }
  return;
}

Assistant:

static inline void bc1_find_sels4_noerr(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];
		bc1_get_block_colors4(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}